

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O2

wchar_t * ON_wString::ToNumber(wchar_t *buffer,double value_on_failure,double *value)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  wchar_t wVar6;
  long lVar7;
  long lVar8;
  wchar_t *pwVar9;
  double x;
  char local_buffer [512];
  
  if ((value != (double *)0x0) && (*value = value_on_failure, buffer != (wchar_t *)0x0)) {
    wVar6 = *buffer;
    if ((wVar6 == L'-') || (wVar6 == L'+')) {
      buffer = buffer + 1;
      local_buffer[0] = (char)wVar6;
      lVar7 = 1;
    }
    else {
      lVar7 = 0;
    }
    bVar2 = false;
    pwVar9 = buffer;
    for (lVar8 = 0; wVar6 = buffer[lVar8], (uint)(wVar6 + L'\xffffffd0') < 10; lVar8 = lVar8 + 1) {
      if (lVar7 + lVar8 == 0x200) {
        return (wchar_t *)0x0;
      }
      pwVar9 = pwVar9 + 1;
      local_buffer[lVar8 + lVar7] = (char)wVar6;
      bVar2 = true;
    }
    uVar4 = lVar7 + lVar8;
    if (wVar6 == L'.') {
      if (0x1ff < uVar4) {
        return (wchar_t *)0x0;
      }
      wVar6 = L'.';
      uVar5 = lVar7 + lVar8;
      while( true ) {
        uVar4 = uVar5 + 1;
        pwVar9 = pwVar9 + 1;
        local_buffer[uVar5] = (char)wVar6;
        wVar6 = *pwVar9;
        if (9 < (uint)(wVar6 + L'\xffffffd0')) break;
        bVar2 = true;
        bVar1 = 0x1fe < uVar5;
        uVar5 = uVar4;
        if (bVar1) {
          return (wchar_t *)0x0;
        }
      }
    }
    if (bVar2) {
      if ((wVar6 | 0x20U) != 0x65) {
LAB_005c82f5:
        local_buffer[uVar4] = '\0';
        iVar3 = __isoc99_sscanf(local_buffer,"%lg");
        if (iVar3 != 1) {
          pwVar9 = (wchar_t *)0x0;
        }
        *value = value_on_failure;
        return pwVar9;
      }
      if (uVar4 < 0x200) {
        local_buffer[uVar4] = (char)wVar6;
        wVar6 = pwVar9[1];
        if ((wVar6 != L'-') && (wVar6 != L'+')) {
          pwVar9 = pwVar9 + 1;
          uVar4 = uVar4 + 1;
          goto LAB_005c82d4;
        }
        if (uVar4 != 0x1ff) {
          pwVar9 = pwVar9 + 2;
          uVar5 = uVar4 + 2;
          uVar4 = uVar4 + 1;
          while( true ) {
            local_buffer[uVar4] = (char)wVar6;
            uVar4 = uVar5;
LAB_005c82d4:
            wVar6 = *pwVar9;
            if (9 < (uint)(wVar6 + L'\xffffffd0')) goto LAB_005c82f5;
            if (0x1ff < uVar4) break;
            pwVar9 = pwVar9 + 1;
            uVar5 = uVar4 + 1;
          }
        }
      }
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t* ON_wString::ToNumber(
  const wchar_t* buffer,
  double value_on_failure,
  double* value
  )
{
  if (nullptr == value)
    return nullptr;
  *value = value_on_failure;
  if (nullptr == buffer)
    return nullptr;

  char local_buffer[512];
  const size_t local_buffer_capacity = sizeof(local_buffer) / sizeof(local_buffer[0]);
  size_t local_buffer_count = 0;

  if ('-' == *buffer || '+' == *buffer)
    local_buffer[local_buffer_count++] = (char)(*buffer++);

  bool bHaveMantissa = false;
  while (buffer[0] >= '0' && buffer[0] <= '9')
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);
    bHaveMantissa = true;
  }

  if ('.' == *buffer)
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);

    while (buffer[0] >= '0' && buffer[0] <= '9')
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
      bHaveMantissa = true;
    }
  }

  if (false == bHaveMantissa)
    return nullptr;

  if ('e' == *buffer || 'E' == *buffer)
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);

    if ('-' == *buffer || '+' == *buffer)
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
    }

    while (buffer[0] >= '0' && buffer[0] <= '9')
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
    }
  }

  local_buffer[local_buffer_count++] = 0;

  double x = value_on_failure;
#if defined(ON_COMPILER_CLANG) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  if (1 == sscanf(local_buffer, "%lg", &x))
  {
    *value = x;
    return buffer;
  }
#else
  if (1 == sscanf_l(local_buffer, ON_Locale::InvariantCulture.NumericLocalePtr(), "%lg", &x))
  {
    *value = x;
    return buffer;
  }
#endif
#else
  if (1 == _sscanf_s_l(local_buffer, "%lg", ON_Locale::InvariantCulture.NumericLocalePtr(), &x))
  {
    *value = x;
    return buffer;
  }
#endif
  *value = value_on_failure;
  return nullptr;
}